

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser_error parse_pit_mon_ban(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *name;
  monster_race *pmVar3;
  undefined8 *puVar4;
  
  pvVar2 = parser_priv(p);
  name = parser_getsym(p,"race");
  pmVar3 = lookup_monster(name);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    puVar4 = (undefined8 *)mem_zalloc(0x10);
    puVar4[1] = pmVar3;
    *puVar4 = *(undefined8 *)((long)pvVar2 + 0x70);
    *(undefined8 **)((long)pvVar2 + 0x70) = puVar4;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_pit_mon_ban(struct parser *p) {
	struct pit_profile *pit = parser_priv(p);
	struct pit_forbidden_monster *monsters;
	struct monster_race *r = lookup_monster(parser_getsym(p, "race"));

	if (!pit)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	monsters = mem_zalloc(sizeof *monsters);
	monsters->race = r;
	monsters->next = pit->forbidden_monsters;
	pit->forbidden_monsters = monsters;
	return PARSE_ERROR_NONE;
}